

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.cpp
# Opt level: O0

void polyscope::saveImage(string *name,uchar *buffer,int w,int h,int channels)

{
  bool bVar1;
  string *in_RDI;
  undefined2 uVar2;
  int in_stack_fffffffffffffecc;
  uint stride_bytes;
  uint uVar3;
  void *in_stack_fffffffffffffed0;
  allocator *data;
  undefined4 in_stack_fffffffffffffedc;
  uint comp;
  allocator *filename;
  allocator local_109;
  string local_108 [36];
  uint in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [55];
  allocator local_61;
  string local_60 [32];
  string local_40 [64];
  
  stbi_flip_vertically_on_write(1);
  stbi_write_png_compression_level = 0;
  std::__cxx11::string::string(local_40,in_RDI);
  filename = &local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,".png",filename);
  bVar1 = anon_unknown_5::hasExtension
                    ((string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff20);
  comp = CONCAT13(bVar1,(int3)in_stack_fffffffffffffedc);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::__cxx11::string::~string(local_40);
  if ((comp & 0x1000000) == 0) {
    std::__cxx11::string::string(local_98,in_RDI);
    uVar2 = (undefined2)in_stack_fffffffffffffecc;
    data = &local_b9;
    std::allocator<char>::allocator();
    in_stack_ffffffffffffff1c = in_stack_ffffffffffffff1c & 0xffffff;
    std::__cxx11::string::string(local_b8,".jpg",data);
    bVar1 = anon_unknown_5::hasExtension
                      ((string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       in_stack_ffffffffffffff20);
    stride_bytes = CONCAT13(bVar1,CONCAT12(1,uVar2));
    uVar3 = stride_bytes;
    if (!bVar1) {
      std::__cxx11::string::string((string *)&stack0xffffffffffffff20,in_RDI);
      in_stack_ffffffffffffff1c = CONCAT13(1,(int3)in_stack_ffffffffffffff1c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"jpeg",&local_109);
      bVar1 = anon_unknown_5::hasExtension
                        ((string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                         in_stack_ffffffffffffff20);
      uVar3 = CONCAT13((char)(stride_bytes >> 0x18),CONCAT12(bVar1,(short)stride_bytes));
      stride_bytes = uVar3;
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    if ((in_stack_ffffffffffffff1c & 0x1000000) != 0) {
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    }
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_98);
    if ((uVar3 & 0x10000) == 0) {
      std::__cxx11::string::c_str();
      stbi_write_png((char *)filename,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,comp,data,
                     stride_bytes);
    }
    else {
      std::__cxx11::string::c_str();
      stbi_write_jpg(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                     in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    }
  }
  else {
    std::__cxx11::string::c_str();
    stbi_write_png((char *)filename,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,comp,
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  }
  return;
}

Assistant:

void saveImage(std::string name, unsigned char* buffer, int w, int h, int channels) {

  // our buffers are from openGL, so they are flipped
  stbi_flip_vertically_on_write(1);
  stbi_write_png_compression_level = 0;

  // Auto-detect filename
  if (hasExtension(name, ".png")) {
    stbi_write_png(name.c_str(), w, h, channels, buffer, channels * w);
  } else if (hasExtension(name, ".jpg") || hasExtension(name, "jpeg")) {
    stbi_write_jpg(name.c_str(), w, h, channels, buffer, 100);

    // TGA seems to display different on different machines: our fault or theirs?
    // Both BMP and TGA need alpha channel stripped? bmp doesn't seem to work even with this
    /*
    } else if (hasExtension(name, ".tga")) {
     stbi_write_tga(name.c_str(), w, h, channels, buffer);
    } else if (hasExtension(name, ".bmp")) {
     stbi_write_bmp(name.c_str(), w, h, channels, buffer);
    */

  } else {
    // Fall back on png
    stbi_write_png(name.c_str(), w, h, channels, buffer, channels * w);
  }
}